

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_end_of_entry(archive_read *a)

{
  void *pvVar1;
  wchar_t local_1c;
  wchar_t r;
  lha *lha;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  local_1c = L'\x01';
  if (*(char *)((long)pvVar1 + 0x125) == '\0') {
    if (((*(uint *)((long)pvVar1 + 0x40) & 8) != 0) &&
       (*(short *)((long)pvVar1 + 0xba) != *(short *)((long)pvVar1 + 0x18))) {
      archive_set_error(&a->archive,-1,"LHa data CRC error");
      local_1c = L'\xffffffec';
    }
    *(undefined1 *)((long)pvVar1 + 0x125) = 1;
  }
  return local_1c;
}

Assistant:

static int
lha_end_of_entry(struct archive_read *a)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r = ARCHIVE_EOF;

	if (!lha->end_of_entry_cleanup) {
		if ((lha->setflag & CRC_IS_SET) &&
		    lha->crc != lha->entry_crc_calculated) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "LHa data CRC error");
			r = ARCHIVE_WARN;
		}

		/* End-of-entry cleanup done. */
		lha->end_of_entry_cleanup = 1;
	}
	return (r);
}